

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<ProStringList>::emplace<ProStringList_const&>
          (QMovableArrayOps<ProStringList> *this,qsizetype i,ProStringList *args)

{
  qsizetype *pqVar1;
  ProStringList *pPVar2;
  Data *pDVar3;
  Data *pDVar4;
  long lVar5;
  ProStringList *pPVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QArrayDataPointer<ProString> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    lVar5 = (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.
            size;
    if ((lVar5 == i) &&
       (pPVar6 = (this->super_QGenericArrayOps<ProStringList>).
                 super_QArrayDataPointer<ProStringList>.ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pPVar6 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x5555555555555555)) {
      pDVar4 = (args->super_QList<ProString>).d.d;
      pPVar6[i].super_QList<ProString>.d.d = pDVar4;
      pPVar6[i].super_QList<ProString>.d.ptr = (args->super_QList<ProString>).d.ptr;
      pPVar6[i].super_QList<ProString>.d.size = (args->super_QList<ProString>).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
        i = (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.
            size;
      }
      (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.size =
           i + 1;
      goto LAB_0028c128;
    }
    if ((i == 0) &&
       (pPVar6 = (this->super_QGenericArrayOps<ProStringList>).
                 super_QArrayDataPointer<ProStringList>.ptr,
       (ProStringList *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
       != pPVar6)) {
      pDVar4 = (args->super_QList<ProString>).d.d;
      pPVar6[-1].super_QList<ProString>.d.d = pDVar4;
      pPVar6[-1].super_QList<ProString>.d.ptr = (args->super_QList<ProString>).d.ptr;
      pPVar6[-1].super_QList<ProString>.d.size = (args->super_QList<ProString>).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
        pPVar6 = (this->super_QGenericArrayOps<ProStringList>).
                 super_QArrayDataPointer<ProStringList>.ptr;
        lVar5 = (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>
                .size;
      }
      (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.ptr =
           pPVar6 + -1;
      (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.size =
           lVar5 + 1;
      goto LAB_0028c128;
    }
  }
  local_40.d = (args->super_QList<ProString>).d.d;
  local_40.ptr = (args->super_QList<ProString>).d.ptr;
  local_40.size = (args->super_QList<ProString>).d.size;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar7 = (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.size
          != 0;
  QArrayDataPointer<ProStringList>::detachAndGrow
            ((QArrayDataPointer<ProStringList> *)this,(uint)(i == 0 && bVar7),1,
             (ProStringList **)0x0,(QArrayDataPointer<ProStringList> *)0x0);
  pPVar6 = (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.ptr;
  if (i == 0 && bVar7) {
    pPVar6[-1].super_QList<ProString>.d.d = local_40.d;
    pPVar6[-1].super_QList<ProString>.d.ptr = local_40.ptr;
    pPVar6[-1].super_QList<ProString>.d.size = local_40.size;
    (this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.ptr =
         pPVar6 + -1;
  }
  else {
    pPVar2 = pPVar6 + i;
    memmove(pPVar2 + 1,pPVar6 + i,
            ((this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.
             size - i) * 0x18);
    (pPVar2->super_QList<ProString>).d.d = local_40.d;
    (pPVar2->super_QList<ProString>).d.ptr = local_40.ptr;
    (pPVar2->super_QList<ProString>).d.size = local_40.size;
  }
  local_40.size = 0;
  local_40.ptr = (ProString *)0x0;
  local_40.d = (Data *)0x0;
  pqVar1 = &(this->super_QGenericArrayOps<ProStringList>).super_QArrayDataPointer<ProStringList>.
            size;
  *pqVar1 = *pqVar1 + 1;
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_40);
LAB_0028c128:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }